

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TablePrinter.hpp
# Opt level: O3

void __thiscall trl::TablePrinter::PrintHeader(TablePrinter *this)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  pointer piVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  pointer pbVar8;
  long lVar9;
  pointer pbVar10;
  uint uVar11;
  ulong uVar12;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  PrintHorizontalLine(this,'=');
  std::__ostream_insert<char,std::char_traits<char>>(this->m_outStream,"|",1);
  pbVar10 = (this->m_columnTitles).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar8 = (this->m_columnTitles).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pbVar8 - (long)pbVar10) >> 5)) {
    lVar9 = 0;
    uVar12 = 0;
    do {
      poVar1 = this->m_outStream;
      lVar2 = *(long *)poVar1;
      lVar3 = *(long *)(lVar2 + -0x18);
      uVar11 = 0x80;
      if (this->m_flushLeft != false) {
        uVar11 = 0x20;
      }
      *(uint *)(poVar1 + lVar3 + 0x18) = uVar11 | *(uint *)(poVar1 + lVar3 + 0x18) & 0xffffff4f;
      piVar4 = (this->m_columnWidths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(this->m_columnWidths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
      if (uVar6 <= uVar12) {
LAB_00102a8d:
        uVar7 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar12,uVar6);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        _Unwind_Resume(uVar7);
      }
      *(long *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x10) = (long)piVar4[uVar12];
      uVar6 = (long)pbVar8 - (long)pbVar10 >> 5;
      if (uVar6 <= uVar12) goto LAB_00102a8d;
      std::__cxx11::string::substr((ulong)&local_50,(long)&(pbVar10->_M_dataplus)._M_p + lVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      pbVar10 = (this->m_columnTitles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar8 = (this->m_columnTitles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar5 = (int)((ulong)((long)pbVar8 - (long)pbVar10) >> 5);
      if (uVar12 != iVar5 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->m_outStream,(this->m_columnSeparator)._M_dataplus._M_p,
                   (this->m_columnSeparator)._M_string_length);
        pbVar10 = (this->m_columnTitles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = (this->m_columnTitles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar5 = (int)((ulong)((long)pbVar8 - (long)pbVar10) >> 5);
      }
      uVar12 = uVar12 + 1;
      lVar9 = lVar9 + 0x20;
    } while ((long)uVar12 < (long)iVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->m_outStream,"|\n",2);
  PrintHorizontalLine(this,'=');
  return;
}

Assistant:

void PrintHeader() {

            PrintHorizontalLine('=');
            m_outStream << "|";

            for (int i = 0; i < GetColumnCount(); ++i) {

                if (m_flushLeft)
                    m_outStream << std::left;
                else
                    m_outStream << std::right;

                m_outStream << std::setw(m_columnWidths.at(i)) << m_columnTitles.at(i).substr(0, m_columnWidths.at(i));
                if (i != GetColumnCount() - 1) {
                    m_outStream << m_columnSeparator;
                }
            }

            m_outStream << "|\n";
            PrintHorizontalLine('=');
        }